

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * tar_i64toa(int64_t n0)

{
  char *pcVar1;
  uint64_t local_20;
  char *p;
  uint64_t n;
  int64_t n0_local;
  
  local_20 = n0;
  if (n0 < 0) {
    local_20 = -n0;
  }
  n = local_20;
  tar_i64toa::buff[0x17] = '\0';
  pcVar1 = tar_i64toa::buff + 0x17;
  do {
    p = pcVar1;
    p[-1] = (char)(n % 10) + '0';
    n = n / 10;
    pcVar1 = p + -1;
  } while (n != 0);
  if (n0 < 0) {
    p[-2] = '-';
    pcVar1 = p + -2;
  }
  p = pcVar1;
  return p;
}

Assistant:

const char *
tar_i64toa(int64_t n0)
{
	static char buff[24];
	uint64_t n = n0 < 0 ? -n0 : n0;
	char *p = buff + sizeof(buff);

	*--p = '\0';
	do {
		*--p = '0' + (int)(n % 10);
	} while (n /= 10);
	if (n0 < 0)
		*--p = '-';
	return p;
}